

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void __thiscall
QList<BezierEase::SingleCubicBezier>::QList
          (QList<BezierEase::SingleCubicBezier> *this,qsizetype size)

{
  qreal *pqVar1;
  qreal qVar2;
  qreal qVar3;
  qreal qVar4;
  qreal qVar5;
  qreal qVar6;
  qreal qVar7;
  qreal qVar8;
  SingleCubicBezier *b;
  SingleCubicBezier *pSVar9;
  long lVar10;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayData *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pSVar9 = (SingleCubicBezier *)QArrayData::allocate(&local_28,0x40,0x10,size,KeepSize);
  (this->d).d = (Data *)local_28;
  (this->d).ptr = pSVar9;
  (this->d).size = 0;
  if (size != 0) {
    pSVar9->p3x = 0.0;
    pSVar9->p3y = 0.0;
    pSVar9->p2x = 0.0;
    pSVar9->p2y = 0.0;
    pSVar9->p1x = 0.0;
    pSVar9->p1y = 0.0;
    pSVar9->p0x = 0.0;
    pSVar9->p0y = 0.0;
    if (size != 1) {
      lVar10 = 0x40;
      do {
        qVar2 = pSVar9->p0x;
        qVar3 = pSVar9->p0y;
        qVar4 = pSVar9->p1x;
        qVar5 = pSVar9->p1y;
        qVar6 = pSVar9->p2x;
        qVar7 = pSVar9->p2y;
        qVar8 = pSVar9->p3y;
        pqVar1 = (qreal *)((long)&pSVar9->p3x + lVar10);
        *pqVar1 = pSVar9->p3x;
        pqVar1[1] = qVar8;
        pqVar1 = (qreal *)((long)&pSVar9->p2x + lVar10);
        *pqVar1 = qVar6;
        pqVar1[1] = qVar7;
        pqVar1 = (qreal *)((long)&pSVar9->p1x + lVar10);
        *pqVar1 = qVar4;
        pqVar1[1] = qVar5;
        pqVar1 = (qreal *)((long)&pSVar9->p0x + lVar10);
        *pqVar1 = qVar2;
        pqVar1[1] = qVar3;
        lVar10 = lVar10 + 0x40;
      } while (size << 6 != lVar10);
    }
    (this->d).size = size;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit QList(qsizetype size)
        : d(size)
    {
        if (size)
            d->appendInitialize(size);
    }